

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::disable_ipcs(Container *this)

{
  allocator<char> local_109;
  string local_108;
  path local_e8;
  allocator<char> local_b9;
  string local_b8;
  path local_98;
  allocator<char> local_59;
  string local_58;
  path local_38;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
            (&local_38,(char (*) [24])"/proc/sys/kernel/msgmni",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"0",&local_59);
  write_file(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::filesystem::__cxx11::path::~path(&local_38);
  std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
            (&local_98,(char (*) [24])"/proc/sys/kernel/shmmni",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"0",&local_b9);
  write_file(&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::path<char[21],std::filesystem::__cxx11::path>
            (&local_e8,(char (*) [21])"/proc/sys/kernel/sem",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"0 0 0 0",&local_109);
  write_file(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::filesystem::__cxx11::path::~path(&local_e8);
  return;
}

Assistant:

void Container::disable_ipcs() {
    write_file("/proc/sys/kernel/msgmni", "0");
    write_file("/proc/sys/kernel/shmmni", "0");
    write_file("/proc/sys/kernel/sem", "0 0 0 0");
}